

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBridge.c
# Opt level: O0

DdNode * cuddBddTransferRecur(DdManager *ddS,DdManager *ddD,DdNode *f,st__table *table)

{
  DdNode *T;
  uint uVar1;
  int iVar2;
  abctime aVar3;
  int comple;
  int index;
  DdNode *zero;
  DdNode *one;
  DdNode *res;
  DdNode *var;
  DdNode *e;
  DdNode *t;
  DdNode *fe;
  DdNode *ft;
  st__table *table_local;
  DdNode *f_local;
  DdManager *ddD_local;
  DdManager *ddS_local;
  
  T = ddD->one;
  uVar1 = (uint)f & 1;
  if (*(int *)((ulong)f & 0xfffffffffffffffe) == 0x7fffffff) {
    ddS_local = (DdManager *)((ulong)T ^ (long)(int)uVar1);
  }
  else {
    table_local = (st__table *)((ulong)f ^ (long)(int)uVar1);
    ft = (DdNode *)table;
    f_local = &ddD->sentinel;
    ddD_local = ddS;
    iVar2 = st__lookup(table,(char *)table_local,(char **)&one);
    if (iVar2 == 0) {
      if ((ddD_local->TimeStop != 0) && (aVar3 = Abc_Clock(), ddD_local->TimeStop < aVar3)) {
        return (DdNode *)0x0;
      }
      if ((f_local[0x12].Id != 0) && (aVar3 = Abc_Clock(), f_local[0x12].Id < aVar3)) {
        return (DdNode *)0x0;
      }
      iVar2 = *(int *)&table_local->compare;
      fe = *(DdNode **)&table_local->num_bins;
      t = *(DdNode **)&table_local->max_density;
      e = cuddBddTransferRecur(ddD_local,(DdManager *)f_local,fe,(st__table *)ft);
      if (e == (DdNode *)0x0) {
        ddS_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)e & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)e & 0xfffffffffffffffe) + 4) + 1;
        var = cuddBddTransferRecur(ddD_local,(DdManager *)f_local,t,(st__table *)ft);
        if (var == (DdNode *)0x0) {
          Cudd_RecursiveDeref((DdManager *)f_local,e);
          ddS_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)var & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)var & 0xfffffffffffffffe) + 4) + 1;
          res = cuddUniqueInter((DdManager *)f_local,iVar2,T,(DdNode *)((ulong)T ^ 1));
          if (res == (DdNode *)0x0) {
            Cudd_RecursiveDeref((DdManager *)f_local,e);
            Cudd_RecursiveDeref((DdManager *)f_local,var);
            ddS_local = (DdManager *)0x0;
          }
          else {
            one = cuddBddIteRecur((DdManager *)f_local,res,e,var);
            if (one == (DdNode *)0x0) {
              Cudd_RecursiveDeref((DdManager *)f_local,e);
              Cudd_RecursiveDeref((DdManager *)f_local,var);
              ddS_local = (DdManager *)0x0;
            }
            else {
              *(int *)(((ulong)one & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)one & 0xfffffffffffffffe) + 4) + 1;
              Cudd_RecursiveDeref((DdManager *)f_local,e);
              Cudd_RecursiveDeref((DdManager *)f_local,var);
              iVar2 = st__add_direct((st__table *)ft,(char *)table_local,(char *)one);
              if (iVar2 == -10000) {
                Cudd_RecursiveDeref((DdManager *)f_local,one);
                ddS_local = (DdManager *)0x0;
              }
              else {
                ddS_local = (DdManager *)((ulong)one ^ (long)(int)uVar1);
              }
            }
          }
        }
      }
    }
    else {
      ddS_local = (DdManager *)((ulong)one ^ (long)(int)uVar1);
    }
  }
  return &ddS_local->sentinel;
}

Assistant:

static DdNode *
cuddBddTransferRecur(
  DdManager * ddS,
  DdManager * ddD,
  DdNode * f,
  st__table * table)
{
    DdNode *ft, *fe, *t, *e, *var, *res;
    DdNode *one, *zero;
    int    index;
    int    comple = 0;

    statLine(ddD);
    one = DD_ONE(ddD);
    comple = Cudd_IsComplement(f);

    /* Trivial cases. */
    if (Cudd_IsConstant(f)) return(Cudd_NotCond(one, comple));

    /* Make canonical to increase the utilization of the cache. */
    f = Cudd_NotCond(f,comple);
    /* Now f is a regular pointer to a non-constant node. */

    /* Check the cache. */
    if ( st__lookup(table, (const char *)f, (char **)&res))
        return(Cudd_NotCond(res,comple));

    if ( ddS->TimeStop && Abc_Clock() > ddS->TimeStop )
        return NULL;
    if ( ddD->TimeStop && Abc_Clock() > ddD->TimeStop )
        return NULL;
    
    /* Recursive step. */
    index = f->index;
    ft = cuddT(f); fe = cuddE(f);

    t = cuddBddTransferRecur(ddS, ddD, ft, table);
    if (t == NULL) {
        return(NULL);
    }
    cuddRef(t);

    e = cuddBddTransferRecur(ddS, ddD, fe, table);
    if (e == NULL) {
        Cudd_RecursiveDeref(ddD, t);
        return(NULL);
    }
    cuddRef(e);

    zero = Cudd_Not(one);
    var = cuddUniqueInter(ddD,index,one,zero);
    if (var == NULL) {
        Cudd_RecursiveDeref(ddD, t);
        Cudd_RecursiveDeref(ddD, e);
        return(NULL);
    }
    res = cuddBddIteRecur(ddD,var,t,e);
    if (res == NULL) {
        Cudd_RecursiveDeref(ddD, t);
        Cudd_RecursiveDeref(ddD, e);
        return(NULL);
    }
    cuddRef(res);
    Cudd_RecursiveDeref(ddD, t);
    Cudd_RecursiveDeref(ddD, e);

    if ( st__add_direct(table, (char *) f, (char *) res) == st__OUT_OF_MEM) {
        Cudd_RecursiveDeref(ddD, res);
        return(NULL);
    }
    return(Cudd_NotCond(res,comple));

}